

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

bool __thiscall wasm::WATParser::Lexer::takeUntilParen(Lexer *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  while( true ) {
    sVar1 = this->pos;
    sVar2 = (this->buffer)._M_len;
    if (sVar1 == sVar2) break;
    bVar3 = peekLParen(this);
    if (bVar3) break;
    bVar3 = peekRParen(this);
    if (bVar3) break;
    takeString_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_50,this);
    bVar3 = local_50._M_engaged;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_50);
    if (bVar3 == false) {
      this->pos = this->pos + 1;
      advance(this);
    }
  }
  return sVar1 != sVar2;
}

Assistant:

bool takeUntilParen() {
    while (true) {
      if (empty()) {
        return false;
      }
      if (peekLParen() || peekRParen()) {
        return true;
      }
      // Do not count the parentheses in strings.
      if (takeString()) {
        continue;
      }
      ++pos;
      advance();
    }
  }